

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIO.cpp
# Opt level: O3

void anon_unknown.dwarf_37635::testFlatTiledImage1(string *fileName)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  Header hdr;
  FlatImage img1;
  long *local_b8;
  undefined8 uStack_b0;
  long local_a8 [5];
  undefined8 local_80;
  FlatImage local_78 [104];
  
  local_b8 = (long *)0x0;
  uStack_b0 = 0x500000005;
  Imf_3_2::FlatImage::FlatImage(local_78,(Box *)&local_b8,MIPMAP_LEVELS,ROUND_DOWN);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"H","");
  Imf_3_2::Image::insertChannel((string *)local_78,(PixelType)&local_b8,1,1,true);
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  Imf_3_2::saveImage((string *)fileName,(Image *)local_78);
  local_80 = 0;
  Imf_3_2::Header::Header((Header *)0x3f800000,0x3f800000,&local_b8,0x40,0x40,&local_80,0,3);
  plVar3 = (long *)Imf_3_2::loadImage((string *)fileName,(Header *)&local_b8);
  if (plVar3 != (long *)0x0) {
    lVar4 = __dynamic_cast(plVar3,&Imf_3_2::Image::typeinfo,&Imf_3_2::FlatImage::typeinfo,0);
    if (lVar4 != 0) {
      iVar2 = Imf_3_2::Image::levelMode();
      if (iVar2 != 1) {
        __assert_fail("img2->levelMode () == MIPMAP_LEVELS",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                      ,0x51,"void (anonymous namespace)::testFlatTiledImage1(const string &)");
      }
      iVar2 = Imf_3_2::Image::levelRoundingMode();
      if (iVar2 == 0) {
        cVar1 = Imf_3_2::Header::hasTileDescription();
        if (cVar1 != '\0') {
          (**(code **)(*plVar3 + 8))(plVar3);
          Imf_3_2::Header::~Header((Header *)&local_b8);
          Imf_3_2::FlatImage::~FlatImage(local_78);
          return;
        }
        __assert_fail("hdr.hasTileDescription ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                      ,0x53,"void (anonymous namespace)::testFlatTiledImage1(const string &)");
      }
      __assert_fail("img2->levelRoundingMode () == ROUND_DOWN",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                    ,0x52,"void (anonymous namespace)::testFlatTiledImage1(const string &)");
    }
  }
  __assert_fail("dynamic_cast<FlatImage*> (img2)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                ,0x50,"void (anonymous namespace)::testFlatTiledImage1(const string &)");
}

Assistant:

void
testFlatTiledImage1 (const string& fileName)
{
    FlatImage img1 (Box2i (V2i (0, 0), V2i (5, 5)), MIPMAP_LEVELS, ROUND_DOWN);
    img1.insertChannel ("H", HALF);
    saveImage (fileName, img1);

    Header hdr;
    Image* img2 = loadImage (fileName, hdr);

    assert (dynamic_cast<FlatImage*> (img2));
    assert (img2->levelMode () == MIPMAP_LEVELS);
    assert (img2->levelRoundingMode () == ROUND_DOWN);
    assert (hdr.hasTileDescription ());

    delete img2;
}